

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::GeneratedMetadataFileName
                   (string *__return_storage_ptr__,string *proto_file,bool is_descriptor)

{
  __type _Var1;
  string *psVar2;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8 [36];
  undefined4 local_84;
  string local_80 [4];
  int lastindex;
  string file_no_suffix;
  allocator<char> local_49;
  string local_48 [8];
  string result;
  int first_index;
  int start_index;
  bool is_descriptor_local;
  string *proto_file_local;
  
  result.field_2._12_4_ = std::__cxx11::string::find_first_of((char *)proto_file,0x5dd34c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"GPBMetadata/",&local_49);
  std::allocator<char>::~allocator(&local_49);
  _Var1 = std::operator==(proto_file,&kEmptyFile_abi_cxx11_);
  if (_Var1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kEmptyMetadataFile_abi_cxx11_);
    file_no_suffix.field_2._8_4_ = 1;
  }
  else if (is_descriptor) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kDescriptorMetadataFile_abi_cxx11_);
    file_no_suffix.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string(local_80);
    local_84 = std::__cxx11::string::find_last_of((char *)proto_file,0x5deb30);
    _Var1 = std::operator==(proto_file,&kEmptyFile_abi_cxx11_);
    if (_Var1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&kEmptyMetadataFile_abi_cxx11_);
    }
    else {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)proto_file);
      std::__cxx11::string::operator=(local_80,local_a8);
      std::__cxx11::string::~string(local_a8);
      while (result.field_2._12_4_ != -1) {
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)local_80);
        UnderscoresToCamelCase(&local_c8,&local_e8,true);
        std::__cxx11::string::operator+=(local_48,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::operator+=(local_48,"/");
        result.field_2._12_4_ = std::__cxx11::string::find_first_of((char *)local_80,0x5dd34c);
      }
      std::__cxx11::string::substr((ulong)&local_148,(ulong)local_80);
      UnderscoresToCamelCase(&local_128,&local_148,true);
      RenameEmpty(&local_108,&local_128);
      std::__cxx11::string::operator+=(local_48,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      psVar2 = (string *)std::__cxx11::string::operator+=(local_48,".php");
      std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    }
    file_no_suffix.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_80);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const std::string& proto_file,
                                      bool is_descriptor) {
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "GPBMetadata/";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  while (first_index != string::npos) {
    result += UnderscoresToCamelCase(
        file_no_suffix.substr(start_index, first_index - start_index), true);
    result += "/";
    start_index = first_index + 1;
    first_index = file_no_suffix.find_first_of("/", start_index);
  }

  // Append file name.
  result += RenameEmpty(UnderscoresToCamelCase(
      file_no_suffix.substr(start_index, first_index - start_index), true));

  return result += ".php";
}